

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O3

void opengv::generateRandom2D2DCorrespondences
               (translation_t *position1,rotation_t *rotation1,translation_t *position2,
               rotation_t *rotation2,translations_t *camOffsets,rotations_t *camRotations,
               size_t numberPoints,double noise,double outlierFraction,
               bearingVectors_t *bearingVectors1,bearingVectors_t *bearingVectors2,
               vector<int,_std::allocator<int>_> *camCorrespondences1,
               vector<int,_std::allocator<int>_> *camCorrespondences2,MatrixXd *gt)

{
  pointer *ppMVar1;
  double *pdVar2;
  double *pdVar3;
  pointer pMVar4;
  pointer pMVar5;
  iterator iVar6;
  iterator iVar7;
  undefined1 auVar8 [16];
  translations_t *ptVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  rotations_t *prVar14;
  void *pvVar15;
  undefined8 *puVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  SrcEvaluatorType srcEvaluator;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_XMM11 [16];
  Vector3d local_1a8;
  double local_190;
  translations_t *local_188;
  double local_180;
  double local_178 [3];
  rotations_t *local_160;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  double local_138;
  double dStack_130;
  undefined1 local_128 [16];
  double local_118;
  double dStack_110;
  undefined1 local_108 [16];
  double local_f8;
  double dStack_f0;
  double local_e8;
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  undefined1 local_b8 [16];
  double local_a8;
  ulong local_a0;
  rotation_t *local_98;
  double local_90;
  double local_88;
  double dStack_80;
  double local_78;
  undefined8 uStack_70;
  Vector3d local_68;
  Vector3d local_48;
  
  local_188 = camOffsets;
  local_160 = camRotations;
  local_a8 = outlierFraction;
  local_98 = rotation1;
  if ((gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols != 0)
  {
    lVar25 = 0;
    uVar24 = 0;
    local_190 = noise;
    do {
      generateRandomPoint(&local_1a8,8.0,4.0);
      uVar17 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows;
      pdVar3 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      uVar21 = uVar17;
      if ((((ulong)(pdVar3 + uVar17 * uVar24) & 7) == 0) &&
         (uVar21 = (ulong)(-((uint)((ulong)(pdVar3 + uVar17 * uVar24) >> 3) & 0x1fffffff) & 7),
         (long)uVar17 <= (long)uVar21)) {
        uVar21 = uVar17;
      }
      uVar22 = uVar17 - uVar21;
      uVar18 = uVar22 + 7;
      if (-1 < (long)uVar22) {
        uVar18 = uVar22;
      }
      if (0 < (long)uVar21) {
        uVar23 = 0;
        do {
          *(double *)((long)pdVar3 + uVar23 * 8 + uVar17 * lVar25) =
               local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[uVar23];
          uVar23 = uVar23 + 1;
        } while (uVar21 != uVar23);
      }
      uVar18 = (uVar18 & 0xfffffffffffffff8) + uVar21;
      if (7 < (long)uVar22) {
        do {
          dVar35 = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[uVar21 + 1];
          dVar26 = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[uVar21 + 2];
          dVar30 = (&local_190)[uVar21];
          ptVar9 = (&local_188)[uVar21];
          dVar31 = (&local_180)[uVar21];
          dVar10 = *(double *)((long)local_178 + uVar21 * 8);
          dVar11 = *(double *)((long)local_178 + uVar21 * 8 + 8);
          pdVar2 = (double *)((long)pdVar3 + uVar21 * 8 + uVar17 * lVar25);
          *pdVar2 = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data.array[uVar21];
          pdVar2[1] = dVar35;
          pdVar2[2] = dVar26;
          pdVar2[3] = dVar30;
          pdVar2[4] = (double)ptVar9;
          pdVar2[5] = dVar31;
          pdVar2[6] = dVar10;
          pdVar2[7] = dVar11;
          uVar21 = uVar21 + 8;
        } while ((long)uVar21 < (long)uVar18);
      }
      if ((long)uVar18 < (long)uVar17) {
        do {
          *(double *)((long)pdVar3 + uVar18 * 8 + uVar17 * lVar25) =
               local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar17 != uVar18);
      }
      uVar24 = uVar24 + 1;
      lVar25 = lVar25 + 8;
      uVar17 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols;
    } while (uVar24 < uVar17);
    if (uVar17 != 0) {
      uVar24 = 0;
      local_178[0] = 0.0;
      local_180 = 0.0;
      local_a0 = ((long)(local_188->
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_188->
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - 1;
      do {
        pMVar4 = (local_188->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pdVar2 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data;
        lVar25 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_rows;
        local_128 = *(undefined1 (*) [16])
                     &pMVar4[uVar24].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data;
        local_138 = *(double *)
                     ((long)&pMVar4[uVar24].
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data + 0x10);
        pMVar5 = (local_160->
                 super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_148 = pMVar5[uVar24].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[0];
        dStack_140 = *(double *)
                      ((long)&pMVar5[uVar24].
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data + 8);
        pdVar3 = (double *)
                 ((long)&pMVar5[uVar24].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                         .m_storage.m_data + 0x30);
        local_118 = *pdVar3;
        dStack_110 = pdVar3[1];
        local_178[1] = *(double *)
                        ((long)&pMVar5[uVar24].
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data + 0x40);
        local_b8._8_8_ = 0;
        local_b8._0_8_ =
             *(double *)
              ((long)&pMVar5[uVar24].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data + 0x10);
        pdVar3 = (double *)
                 ((long)&pMVar5[uVar24].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                         .m_storage.m_data + 0x18);
        local_158 = *pdVar3;
        dStack_150 = pdVar3[1];
        local_78 = *(double *)
                    ((long)&pMVar5[uVar24].
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                            m_data + 0x28);
        uStack_70 = 0;
        pvVar15 = malloc(0x58);
        if (pvVar15 == (void *)0x0) {
LAB_001217eb:
          puVar16 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar16 = srand;
          __cxa_throw(puVar16,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        lVar25 = lVar25 * (long)local_178[0];
        uVar17 = (ulong)pvVar15 & 0xffffffffffffffc0;
        lVar19 = 0;
        *(void **)(uVar17 + 0x38) = pvVar15;
        do {
          *(double *)(uVar17 + 0x40 + lVar19 * 8) =
               *(double *)((long)pdVar2 + lVar19 * 8 + lVar25) -
               (position1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 3);
        local_f8 = *(double *)(uVar17 + 0x40);
        dStack_f0 = *(double *)(uVar17 + 0x48);
        local_d8 = local_f8 *
                   (local_98->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                   m_storage.m_data.array[3];
        dStack_d0 = dStack_f0 *
                    (local_98->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[4];
        local_c8 = local_f8 *
                   (local_98->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                   m_storage.m_data.array[0];
        dStack_c0 = dStack_f0 *
                    (local_98->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[1];
        local_f8 = local_f8 *
                   (local_98->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                   m_storage.m_data.array[6];
        dStack_f0 = dStack_f0 *
                    (local_98->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[7];
        local_e8 = *(double *)(uVar17 + 0x50);
        local_178[2] = local_e8 *
                       (local_98->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[8];
        local_108 = vmovhps_avx(*(undefined1 (*) [16])
                                 ((local_98->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array + 2),
                                (local_98->
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[5]);
        dStack_e0 = local_e8;
        free(pvVar15);
        pdVar3 = (gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data;
        pvVar15 = malloc(0x58);
        if (pvVar15 == (void *)0x0) goto LAB_001217eb;
        uVar17 = (ulong)pvVar15 & 0xffffffffffffffc0;
        lVar19 = 0;
        *(void **)(uVar17 + 0x38) = pvVar15;
        local_88 = local_c8 + dStack_c0 + (double)local_108._0_8_ * local_e8;
        dStack_80 = local_d8 + dStack_d0 + (double)local_108._8_8_ * dStack_e0;
        local_90 = local_f8 + dStack_f0 + local_178[2];
        do {
          *(double *)(uVar17 + 0x40 + lVar19 * 8) =
               *(double *)((long)pdVar3 + lVar19 * 8 + lVar25) -
               (position2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[lVar19];
          lVar19 = lVar19 + 1;
        } while (lVar19 != 3);
        local_f8 = *(double *)(uVar17 + 0x40);
        dStack_f0 = *(double *)(uVar17 + 0x48);
        local_d8 = local_f8 *
                   (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                   m_storage.m_data.array[3];
        dStack_d0 = dStack_f0 *
                    (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[4];
        local_c8 = local_f8 *
                   (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                   m_storage.m_data.array[0];
        dStack_c0 = dStack_f0 *
                    (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[1];
        local_f8 = local_f8 *
                   (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                   m_storage.m_data.array[6];
        dStack_f0 = dStack_f0 *
                    (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[7];
        local_e8 = *(double *)(uVar17 + 0x50);
        local_178[2] = local_e8 *
                       (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data.array[8];
        local_108 = vmovhps_avx(*(undefined1 (*) [16])
                                 ((rotation2->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                  m_storage.m_data.array + 2),
                                (rotation2->
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                                m_storage.m_data.array[5]);
        dStack_e0 = local_e8;
        free(pvVar15);
        auVar8._8_8_ = dStack_80;
        auVar8._0_8_ = local_88;
        auVar40._8_8_ = uStack_70;
        auVar40._0_8_ = local_78;
        auVar40 = vunpcklpd_avx(local_b8,auVar40);
        auVar8 = vsubpd_avx(auVar8,local_128);
        dVar30 = local_90 - local_138;
        dVar35 = auVar8._0_8_;
        dVar26 = auVar8._8_8_;
        local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = dVar30 * local_178[1] + dVar35 * local_118 + dVar26 * dStack_110;
        local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = auVar40._0_8_ * dVar30 + local_148 * dVar35 + dStack_140 * dVar26;
        local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = auVar40._8_8_ * dVar30 + local_158 * dVar35 + dStack_150 * dVar26;
        iVar6._M_current =
             (bearingVectors1->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (bearingVectors1->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          local_b8 = auVar40;
          std::
          vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
          ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                    ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                      *)bearingVectors1,iVar6,&local_1a8);
          auVar40 = local_b8;
        }
        else {
          ((iVar6._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[2] =
               local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
          ((iVar6._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[0] =
               local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
          ((iVar6._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[1] =
               local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
          ppMVar1 = &(bearingVectors1->
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppMVar1 = *ppMVar1 + 1;
        }
        auVar27._0_8_ = local_c8 + dStack_c0 + (double)local_108._0_8_ * local_e8;
        auVar27._8_8_ = local_d8 + dStack_d0 + (double)local_108._8_8_ * dStack_e0;
        auVar8 = vsubpd_avx(auVar27,local_128);
        dVar35 = auVar8._0_8_;
        dVar26 = auVar8._8_8_;
        dVar30 = (local_f8 + dStack_f0 + local_178[2]) - local_138;
        local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2] = dVar30 * local_178[1] + dVar35 * local_118 + dVar26 * dStack_110;
        local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = auVar40._0_8_ * dVar30 + local_148 * dVar35 + dStack_140 * dVar26;
        local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = auVar40._8_8_ * dVar30 + local_158 * dVar35 + dStack_150 * dVar26;
        iVar6._M_current =
             (bearingVectors2->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (iVar6._M_current ==
            (bearingVectors2->
            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
          ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                    ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                      *)bearingVectors2,iVar6,&local_1a8);
          dVar35 = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0];
        }
        else {
          ((iVar6._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[2] =
               local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
          ((iVar6._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[0] =
               local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[0];
          ((iVar6._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
          m_storage.m_data.array[1] =
               local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
          ppMVar1 = &(bearingVectors2->
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppMVar1 = *ppMVar1 + 1;
          dVar35 = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0];
        }
        dVar30 = local_180;
        local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0]._4_4_ = (undefined4)((ulong)dVar35 >> 0x20);
        pMVar4 = (bearingVectors1->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        auVar8 = *(undefined1 (*) [16])
                  &pMVar4[(long)local_180].
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data;
        dVar26 = *(double *)
                  ((long)&pMVar4[(long)local_180].
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data + 0x10);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = dVar26 * dVar26 + auVar8._0_8_ * auVar8._0_8_ + auVar8._8_8_ * auVar8._8_8_;
        auVar40 = vsqrtpd_avx(auVar32);
        dVar31 = auVar40._0_8_;
        auVar37._8_8_ = dVar31;
        auVar37._0_8_ = dVar31;
        auVar8 = vdivpd_avx(auVar8,auVar37);
        *(undefined1 (*) [16])
         &pMVar4[(long)local_180].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data = auVar8;
        *(double *)
         ((long)&pMVar4[(long)local_180].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data +
         0x10) = dVar26 / dVar31;
        pMVar4 = (bearingVectors2->
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        auVar8 = *(undefined1 (*) [16])
                  &pMVar4[(long)local_180].
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data;
        dVar26 = *(double *)
                  ((long)&pMVar4[(long)local_180].
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data + 0x10);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = dVar26 * dVar26 + auVar8._0_8_ * auVar8._0_8_ + auVar8._8_8_ * auVar8._8_8_;
        auVar40 = vsqrtpd_avx(auVar33);
        dVar31 = auVar40._0_8_;
        auVar38._8_8_ = dVar31;
        auVar38._0_8_ = dVar31;
        auVar8 = vdivpd_avx(auVar8,auVar38);
        *(undefined1 (*) [16])
         &pMVar4[(long)local_180].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
          m_storage.m_data = auVar8;
        *(double *)
         ((long)&pMVar4[(long)local_180].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data +
         0x10) = dVar26 / dVar31;
        if (0.0 < local_190) {
          pMVar4 = (bearingVectors1->
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = *(double *)
                      ((long)&pMVar4[(long)local_180].
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data + 0x10);
          pMVar4 = pMVar4 + (long)local_180;
          local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array[0];
          local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = *(double *)
                      ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                              .m_storage.m_data + 8);
          local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = dVar35;
          addNoise(&local_1a8,local_190,&local_48);
          pMVar4 = (bearingVectors1->
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          *(double *)
           ((long)&pMVar4[(long)dVar30].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                   .m_storage.m_data + 0x10) =
               local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
          pMVar4 = pMVar4 + (long)dVar30;
          (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[0] = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
          *(double *)
           ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data + 8) =
               local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
          pMVar4 = (bearingVectors2->
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[2] = *(double *)
                      ((long)&pMVar4[(long)dVar30].
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                              .m_data + 0x10);
          pMVar4 = pMVar4 + (long)dVar30;
          local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0] = (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array[0];
          local_68.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[1] = *(double *)
                      ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                              .m_storage.m_data + 8);
          addNoise(&local_1a8,local_190,&local_68);
          pMVar4 = (bearingVectors2->
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          *(double *)
           ((long)&pMVar4[(long)dVar30].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                   .m_storage.m_data + 0x10) =
               local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
          pMVar4 = pMVar4 + (long)dVar30;
          (pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[0] = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array[0];
          *(double *)
           ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data + 8) =
               local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1];
        }
        iVar20 = (int)uVar24;
        iVar7._M_current =
             (camCorrespondences1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (camCorrespondences1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0]._0_4_ = iVar20;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (camCorrespondences1,iVar7,(int *)&local_1a8);
        }
        else {
          *iVar7._M_current = iVar20;
          (camCorrespondences1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
        iVar7._M_current =
             (camCorrespondences2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (camCorrespondences2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0]._0_4_ = iVar20;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (camCorrespondences2,iVar7,(int *)&local_1a8);
        }
        else {
          *iVar7._M_current = iVar20;
          (camCorrespondences2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
          local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
          array[0]._0_4_ = iVar20;
        }
        uVar17 = uVar24 + 1;
        uVar24 = 0;
        if (uVar17 <= local_a0) {
          uVar24 = uVar17;
        }
        local_178[0] = (double)((long)local_178[0] + 8);
        local_180 = (double)((long)local_180 + 1);
      } while ((ulong)local_180 <
               (ulong)(gt->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_cols);
      goto LAB_001215f8;
    }
  }
  uVar24 = 0;
LAB_001215f8:
  prVar14 = local_160;
  auVar8 = vcvtusi2sd_avx512f(in_XMM11,numberPoints);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar8._0_8_ * local_a8;
  auVar8 = vroundsd_avx(auVar28,auVar28,9);
  lVar25 = vcvttsd2usi_avx512f(auVar8);
  if (lVar25 != 0) {
    local_190 = (double)(uVar24 * 3);
    local_178[0] = (double)(uVar24 * 9);
    lVar19 = 0x10;
    do {
      pMVar4 = (local_188->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      puVar16 = (undefined8 *)
                ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data + (long)local_190 * 8);
      local_158 = (double)*puVar16;
      dStack_150 = (double)puVar16[1];
      local_178[1] = *(double *)
                      ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                              .m_storage.m_data + (long)local_190 * 8 + 0x10);
      pMVar5 = (prVar14->
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pdVar3 = (double *)
               ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data + (long)local_178[0] * 8);
      local_138 = *pdVar3;
      dStack_130 = pdVar3[1];
      pdVar3 = (double *)
               ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data + (long)local_178[0] * 8 + 0x18);
      local_148 = *pdVar3;
      dStack_140 = pdVar3[1];
      pdVar3 = (double *)
               ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data + (long)local_178[0] * 8 + 0x30);
      local_118 = *pdVar3;
      dStack_110 = pdVar3[1];
      local_180 = *(double *)
                   ((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                           m_storage.m_data + (long)local_178[0] * 8 + 0x40);
      auVar29._8_8_ = 0;
      auVar29._0_8_ =
           *(ulong *)((long)&(pMVar5->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                             m_storage.m_data + (long)local_178[0] * 8 + 0x10);
      local_128 = vmovhps_avx(auVar29,*(undefined8 *)
                                       ((long)&(pMVar5->
                                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                               ).m_storage.m_data + (long)local_178[0] * 8 + 0x28));
      generateRandomPoint(&local_1a8,8.0,4.0);
      auVar12._4_4_ =
           local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0]._4_4_;
      auVar12._0_4_ =
           local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[0]._0_4_;
      auVar12._8_8_ =
           local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[1];
      pMVar4 = (bearingVectors2->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      auVar8 = vsubpd_avx(auVar12,*(undefined1 (*) [16])
                                   (position2->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data.array);
      dVar35 = local_1a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] -
               (position2->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
      dVar26 = auVar8._0_8_;
      dVar30 = auVar8._8_8_;
      auVar8 = vmovhpd_avx(*(undefined1 (*) [16])
                            ((rotation2->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                             .m_data.array + 2),
                           (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
                           .m_storage.m_data.array[5]);
      local_178[1] = (dVar35 * (rotation2->
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                               m_storage.m_data.array[8] +
                     dVar26 * (rotation2->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[6] +
                     dVar30 * (rotation2->
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                              m_storage.m_data.array[7]) - local_178[1];
      auVar36._0_8_ =
           dVar35 * auVar8._0_8_ +
           dVar26 * (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[0] +
           dVar30 * (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[1];
      auVar36._8_8_ =
           dVar35 * auVar8._8_8_ +
           dVar26 * (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[3] +
           dVar30 * (rotation2->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                    m_storage.m_data.array[4];
      auVar13._8_8_ = dStack_150;
      auVar13._0_8_ = local_158;
      auVar8 = vsubpd_avx(auVar36,auVar13);
      dVar35 = auVar8._0_8_;
      dVar26 = auVar8._8_8_;
      pdVar3 = (double *)
               ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar19 + -0x10);
      *pdVar3 = local_178[1] * (double)local_128._0_8_ + dVar35 * local_138 + dVar26 * dStack_130;
      pdVar3[1] = local_178[1] * (double)local_128._8_8_ + dVar35 * local_148 + dVar26 * dStack_140;
      *(double *)
       ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data + lVar19) =
           local_178[1] * local_180 + dVar35 * local_118 + dVar26 * dStack_110;
      pMVar4 = (bearingVectors2->
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      auVar8 = *(undefined1 (*) [16])
                ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data + lVar19 + -0x10);
      dVar35 = *(double *)
                ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data + lVar19);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar35 * dVar35 + auVar8._0_8_ * auVar8._0_8_ + auVar8._8_8_ * auVar8._8_8_;
      auVar40 = vsqrtpd_avx(auVar34);
      dVar26 = auVar40._0_8_;
      auVar39._8_8_ = dVar26;
      auVar39._0_8_ = dVar26;
      auVar8 = vdivpd_avx(auVar8,auVar39);
      *(undefined1 (*) [16])
       ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data + lVar19 + -0x10) = auVar8;
      *(double *)
       ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data + lVar19) = dVar35 / dVar26;
      lVar19 = lVar19 + 0x18;
      lVar25 = lVar25 + -1;
    } while (lVar25 != 0);
  }
  return;
}

Assistant:

void
opengv::generateRandom2D2DCorrespondences(
    const translation_t & position1,
    const rotation_t & rotation1,
    const translation_t & position2,
    const rotation_t & rotation2,
    const translations_t & camOffsets,
    const rotations_t & camRotations,
    size_t numberPoints,
    double noise,
    double outlierFraction,
    bearingVectors_t & bearingVectors1,
    bearingVectors_t & bearingVectors2,
    std::vector<int> & camCorrespondences1,
    std::vector<int> & camCorrespondences2,
    Eigen::MatrixXd & gt )
{
  //initialize point-cloud
  double minDepth = 4;
  double maxDepth = 8;

  for( size_t i = 0; i < (size_t) gt.cols(); i++ )
    gt.col(i) = generateRandomPoint( maxDepth, minDepth );

  //create the 2D3D-correspondences by looping through the cameras
  size_t numberCams = camOffsets.size();
  size_t camCorrespondence = 0;

  for( size_t i = 0; i < (size_t) gt.cols(); i++ )
  {
    //get the camera transformation
    translation_t camOffset = camOffsets[camCorrespondence];
    rotation_t camRotation = camRotations[camCorrespondence];

    //get the point in viewpoint 1
    point_t bodyPoint1 = rotation1.transpose()*(gt.col(i) - position1);

    //get the point in viewpoint 2
    point_t bodyPoint2 = rotation2.transpose()*(gt.col(i) - position2);

    //get the point in the camera in viewpoint 1
    bearingVectors1.push_back(camRotation.transpose()*(bodyPoint1 - camOffset));

    //get the point in the camera in viewpoint 2
    bearingVectors2.push_back(camRotation.transpose()*(bodyPoint2 - camOffset));

    //normalize the bearing-vectors
    bearingVectors1[i] = bearingVectors1[i] / bearingVectors1[i].norm();
    bearingVectors2[i] = bearingVectors2[i] / bearingVectors2[i].norm();

    //add noise
    if( noise > 0.0 )
    {
      bearingVectors1[i] = addNoise(noise,bearingVectors1[i]);
      bearingVectors2[i] = addNoise(noise,bearingVectors2[i]);
    }

    //push back the camera correspondences
    camCorrespondences1.push_back(camCorrespondence);
    camCorrespondences2.push_back(camCorrespondence++);
    if(camCorrespondence > (numberCams - 1) )
      camCorrespondence = 0;
  }

  //add outliers
  size_t numberOutliers = (size_t) floor(outlierFraction*numberPoints);
  for(size_t i = 0; i < numberOutliers; i++)
  {
    //get the corresponding camera transformation
    translation_t camOffset = camOffsets[camCorrespondence];
    rotation_t camRotation = camRotations[camCorrespondence];

    //create random point
    point_t p = generateRandomPoint(8,4);

    //project this point into viewpoint 2
    point_t bodyPoint = rotation2.transpose()*(p - position2);

    //project this point into the corresponding camera in viewpoint 2
    //and use as outlier
    bearingVectors2[i] = camRotation.transpose()*(bodyPoint - camOffset);

    //normalize the bearing vector
    bearingVectors2[i] = bearingVectors2[i] / bearingVectors2[i].norm();
  }
}